

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

void __thiscall
ON_PostEffects::GetPostEffects
          (ON_PostEffects *this,Types type,ON_SimpleArray<const_ON_PostEffect_*> *a)

{
  undefined8 this_00;
  int iVar1;
  ON_PostEffect **x;
  int local_48;
  int i;
  undefined1 local_38 [8];
  ON_SimpleArray<ON_PostEffect_*> pel;
  ON_SimpleArray<const_ON_PostEffect_*> *a_local;
  Types type_local;
  ON_PostEffects *this_local;
  
  pel._16_8_ = a;
  ON_SimpleArray<ON_PostEffect_*>::ON_SimpleArray((ON_SimpleArray<ON_PostEffect_*> *)local_38);
  (*this->_vptr_ON_PostEffects[7])(this,(ulong)type,(ON_SimpleArray<ON_PostEffect_*> *)local_38);
  local_48 = 0;
  while( true ) {
    iVar1 = ON_SimpleArray<ON_PostEffect_*>::Count((ON_SimpleArray<ON_PostEffect_*> *)local_38);
    this_00 = pel._16_8_;
    if (iVar1 <= local_48) break;
    x = ON_SimpleArray<ON_PostEffect_*>::operator[]
                  ((ON_SimpleArray<ON_PostEffect_*> *)local_38,local_48);
    ON_SimpleArray<const_ON_PostEffect_*>::Append
              ((ON_SimpleArray<const_ON_PostEffect_*> *)this_00,x);
    local_48 = local_48 + 1;
  }
  ON_SimpleArray<ON_PostEffect_*>::~ON_SimpleArray((ON_SimpleArray<ON_PostEffect_*> *)local_38);
  return;
}

Assistant:

void ON_PostEffects::GetPostEffects(ON_PostEffect::Types type, ON_SimpleArray<const ON_PostEffect*>& a) const
{
  ON_SimpleArray<ON_PostEffect*> pel;
  const_cast<ON_PostEffects*>(this)->GetPostEffects(type, pel);
  for (int i = 0; i < pel.Count(); i++)
  {
    a.Append(pel[i]);
  }
}